

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_user_geometry.h
# Opt level: O3

PrimInfo * __thiscall
embree::sse2::UserGeometryISA::createPrimRefArrayMB
          (PrimInfo *__return_storage_ptr__,UserGeometryISA *this,mvector<PrimRef> *prims,
          size_t itime,range<unsigned_long> *r,size_t k,uint geomID)

{
  PrimRef *pPVar1;
  undefined1 auVar2 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar3;
  undefined1 auVar4 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar5;
  undefined4 uVar6;
  float fVar7;
  ulong uVar8;
  size_t sVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  BBox3fa box [2];
  size_t local_f8;
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  void *local_a0;
  float local_98;
  int local_94;
  float *local_90;
  PrimInfo *local_88;
  mvector<PrimRef> *local_80;
  undefined1 local_78 [32];
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  __return_storage_ptr__->begin = 0;
  __return_storage_ptr__->end = 0;
  uVar8 = r->_begin;
  local_88 = __return_storage_ptr__;
  if (uVar8 < r->_end) {
    local_f8 = 0;
    local_c8._8_4_ = 0x7f800000;
    local_c8._0_8_ = 0x7f8000007f800000;
    local_c8._12_4_ = 0x7f800000;
    local_d8._8_4_ = 0x7f800000;
    local_d8._0_8_ = 0x7f8000007f800000;
    local_d8._12_4_ = 0x7f800000;
    local_b8._8_4_ = 0xff800000;
    local_b8._0_8_ = 0xff800000ff800000;
    local_b8._12_4_ = 0xff800000;
    local_e8._8_4_ = 0xff800000;
    local_e8._0_8_ = 0xff800000ff800000;
    local_e8._12_4_ = 0xff800000;
    local_80 = prims;
    do {
      local_a0 = (this->super_UserGeometry).super_AccelSet.super_Geometry.userPtr;
      fVar7 = (float)uVar8;
      local_90 = (float *)local_78;
      local_98 = fVar7;
      local_94 = (int)itime;
      (**(code **)&(this->super_UserGeometry).super_AccelSet.super_Geometry.field_0x58)(&local_a0);
      local_90 = &local_58;
      local_94 = (int)itime + 1;
      uVar6 = (**(code **)&(this->super_UserGeometry).super_AccelSet.super_Geometry.field_0x58)
                        (&local_a0);
      fVar10 = local_78._0_4_;
      fVar11 = local_78._4_4_;
      fVar12 = local_78._8_4_;
      fVar13 = local_78._16_4_;
      fVar14 = local_78._20_4_;
      fVar15 = local_78._24_4_;
      auVar16._0_4_ = -(uint)(fVar10 <= fVar13 && (-1.844e+18 < fVar10 && fVar13 < 1.844e+18));
      auVar16._4_4_ = -(uint)(fVar11 <= fVar14 && (-1.844e+18 < fVar11 && fVar14 < 1.844e+18));
      auVar16._8_4_ = -(uint)(fVar12 <= fVar15 && (-1.844e+18 < fVar12 && fVar15 < 1.844e+18));
      auVar16._12_4_ =
           -(uint)(local_78._12_4_ <= local_78._28_4_ &&
                  (-1.844e+18 < local_78._12_4_ && local_78._28_4_ < 1.844e+18));
      uVar6 = movmskps(uVar6,auVar16);
      sVar9 = k;
      if (((~(byte)uVar6 & 7) == 0) &&
         (auVar18._0_4_ =
               -(uint)((-1.844e+18 < local_58 && local_48 < 1.844e+18) && local_58 <= local_48),
         auVar18._4_4_ =
              -(uint)((-1.844e+18 < fStack_54 && fStack_44 < 1.844e+18) && fStack_54 <= fStack_44),
         auVar18._8_4_ =
              -(uint)((-1.844e+18 < fStack_50 && fStack_40 < 1.844e+18) && fStack_50 <= fStack_40),
         auVar18._12_4_ =
              -(uint)((-1.844e+18 < fStack_4c && fStack_3c < 1.844e+18) && fStack_4c <= fStack_3c),
         uVar6 = movmskps(CONCAT31((int3)((uint)uVar6 >> 8),~(byte)uVar6),auVar18),
         (~(byte)uVar6 & 7) == 0)) {
        auVar2._12_4_ = geomID;
        auVar2._0_12_ = local_78._0_12_;
        local_c8 = minps(local_c8,auVar2);
        auVar4._12_4_ = fVar7;
        auVar4._0_12_ = local_78._16_12_;
        local_b8 = maxps(local_b8,auVar4);
        auVar17._0_4_ = fVar10 + fVar13;
        auVar17._4_4_ = fVar11 + fVar14;
        auVar17._8_4_ = fVar12 + fVar15;
        auVar17._12_4_ = (float)geomID + fVar7;
        local_d8 = minps(local_d8,auVar17);
        local_e8 = maxps(local_e8,auVar17);
        local_f8 = local_f8 + 1;
        sVar9 = k + 1;
        pPVar1 = local_80->items;
        aVar3.m128[3] = (float)geomID;
        aVar3._0_12_ = local_78._0_12_;
        pPVar1[k].lower.field_0 = aVar3;
        aVar5.m128[3] = fVar7;
        aVar5._0_12_ = local_78._16_12_;
        pPVar1[k].upper.field_0 = aVar5;
      }
      uVar8 = uVar8 + 1;
      k = sVar9;
    } while (uVar8 < r->_end);
  }
  else {
    local_f8 = 0;
    local_e8._8_8_ = 0xff800000ff800000;
    local_e8._0_8_ = 0xff800000ff800000;
    local_b8._8_8_ = 0xff800000ff800000;
    local_b8._0_8_ = 0xff800000ff800000;
    local_d8._8_8_ = 0x7f8000007f800000;
    local_d8._0_8_ = 0x7f8000007f800000;
    local_c8._8_8_ = 0x7f8000007f800000;
    local_c8._0_8_ = 0x7f8000007f800000;
  }
  *(undefined8 *)&(local_88->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0
       = local_c8._0_8_;
  *(undefined8 *)
   ((long)&(local_88->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0 + 8) =
       local_c8._8_8_;
  *(undefined8 *)&(local_88->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0
       = local_b8._0_8_;
  *(undefined8 *)
   ((long)&(local_88->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0 + 8) =
       local_b8._8_8_;
  *(undefined8 *)&(local_88->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0
       = local_d8._0_8_;
  *(undefined8 *)
   ((long)&(local_88->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0 + 8) =
       local_d8._8_8_;
  *(undefined8 *)&(local_88->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0
       = local_e8._0_8_;
  *(undefined8 *)
   ((long)&(local_88->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0 + 8) =
       local_e8._8_8_;
  local_88->end = local_f8;
  return local_88;
}

Assistant:

PrimInfo createPrimRefArrayMB(mvector<PrimRef>& prims, size_t itime, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfo pinfo(empty);
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          BBox3fa bounds = empty;
          if (!buildBounds(j,itime,bounds)) continue;
          const PrimRef prim(bounds,geomID,unsigned(j));
          pinfo.add_center2(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }